

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateState.cpp
# Opt level: O0

int __thiscall helics::FederateState::getIntegerProperty(FederateState *this,int intProperty)

{
  int32_t iVar1;
  pointer pLVar2;
  size_t sVar3;
  undefined4 in_ESI;
  long in_RDI;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  switch(in_ESI) {
  case 0x102:
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x589cb1);
    iVar1 = TimeCoordinator::getCurrentIteration
                      ((TimeCoordinator *)CONCAT44(in_ESI,in_stack_ffffffffffffffe8));
    break;
  default:
    std::unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_>::
    operator->((unique_ptr<helics::TimeCoordinator,_std::default_delete<helics::TimeCoordinator>_> *
               )0x589d20);
    iVar1 = TimeCoordinator::getIntegerProperty
                      ((TimeCoordinator *)
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int)((ulong)in_RDI >> 0x20));
    break;
  case 0x10f:
  case 0x110:
  case 0x112:
    pLVar2 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
             operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
                        0x589ccf);
    iVar1 = LogManager::getConsoleLevel(pLVar2);
    break;
  case 0x114:
    pLVar2 = std::unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_>::
             operator->((unique_ptr<helics::LogManager,_std::default_delete<helics::LogManager>_> *)
                        0x589ced);
    LogManager::getLogBuffer(pLVar2);
    sVar3 = LogBuffer::capacity((LogBuffer *)0x589cfd);
    iVar1 = (int32_t)sVar3;
    break;
  case 0x11a:
    iVar1 = *(int32_t *)(in_RDI + 0x298);
  }
  return iVar1;
}

Assistant:

int FederateState::getIntegerProperty(int intProperty) const
{
    switch (intProperty) {
        case defs::Properties::CURRENT_ITERATION:
            return timeCoord->getCurrentIteration();
        case defs::Properties::LOG_LEVEL:
        case defs::Properties::FILE_LOG_LEVEL:
        case defs::Properties::CONSOLE_LOG_LEVEL:
            return mLogManager->getConsoleLevel();
        case defs::Properties::LOG_BUFFER:
            return static_cast<int>(mLogManager->getLogBuffer().capacity());
        case defs::Properties::INDEX_GROUP:
            return indexGroup;
        default:
            return timeCoord->getIntegerProperty(intProperty);
    }
}